

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O3

REF_STATUS ref_edge_tec_ratio(REF_EDGE ref_edge,char *filename)

{
  REF_NODE ref_node;
  REF_DBL *pRVar1;
  uint uVar2;
  REF_DBL in_RAX;
  FILE *__s;
  long lVar3;
  int iVar4;
  long lVar5;
  REF_STATUS RVar6;
  REF_DBL ratio;
  REF_DBL local_38;
  
  ref_node = ref_edge->node;
  local_38 = in_RAX;
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x292,
           "ref_edge_tec_ratio","unable to open file");
    RVar6 = 2;
  }
  else {
    fwrite("title=\"tecplot refine scalar file\"\n",0x23,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\" \"ratio\"\n",0x20,1,__s);
    fprintf(__s,"zone t=\"scalar\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
            (ulong)(uint)(ref_edge->n * 2),(ulong)(uint)ref_edge->n,"point","felineseg");
    if (0 < ref_edge->n) {
      lVar5 = 0;
      do {
        uVar2 = ref_node_ratio(ref_node,ref_edge->e2n[lVar5 * 2],ref_edge->e2n[lVar5 * 2 + 1],
                               &local_38);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
                 0x29f,"ref_edge_tec_ratio",(ulong)uVar2,"rat");
          return uVar2;
        }
        lVar3 = (long)ref_edge->e2n[lVar5 * 2];
        pRVar1 = ref_node->real;
        fprintf(__s," %.16e %.16e %.16e %.16e\n",pRVar1[lVar3 * 0xf],pRVar1[lVar3 * 0xf + 1],
                pRVar1[lVar3 * 0xf + 2],local_38);
        lVar3 = (long)ref_edge->e2n[lVar5 * 2 + 1];
        pRVar1 = ref_node->real;
        fprintf(__s," %.16e %.16e %.16e %.16e\n",pRVar1[lVar3 * 0xf],pRVar1[lVar3 * 0xf + 1],
                pRVar1[lVar3 * 0xf + 2],local_38);
        lVar5 = lVar5 + 1;
      } while (lVar5 < ref_edge->n);
      if (0 < ref_edge->n) {
        uVar2 = 1;
        iVar4 = 0;
        do {
          fprintf(__s," %d %d\n",(ulong)uVar2,(ulong)(uVar2 + 1));
          iVar4 = iVar4 + 1;
          uVar2 = uVar2 + 2;
        } while (iVar4 < ref_edge->n);
      }
    }
    RVar6 = 0;
    fclose(__s);
  }
  return RVar6;
}

Assistant:

REF_FCN REF_STATUS ref_edge_tec_ratio(REF_EDGE ref_edge, const char *filename) {
  REF_NODE ref_node = ref_edge_node(ref_edge);
  REF_INT edge;
  REF_INT node;
  REF_DBL ratio;

  FILE *file;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"tecplot refine scalar file\"\n");
  fprintf(file, "variables = \"x\" \"y\" \"z\" \"ratio\"\n");

  fprintf(
      file,
      "zone t=\"scalar\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      2 * ref_edge_n(ref_edge), ref_edge_n(ref_edge), "point", "felineseg");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_node_ratio(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                       ref_edge_e2n(ref_edge, 1, edge), &ratio),
        "rat");
    node = ref_edge_e2n(ref_edge, 0, edge);
    fprintf(file, " %.16e %.16e %.16e %.16e\n", ref_node_xyz(ref_node, 0, node),
            ref_node_xyz(ref_node, 1, node), ref_node_xyz(ref_node, 2, node),
            ratio);
    node = ref_edge_e2n(ref_edge, 1, edge);
    fprintf(file, " %.16e %.16e %.16e %.16e\n", ref_node_xyz(ref_node, 0, node),
            ref_node_xyz(ref_node, 1, node), ref_node_xyz(ref_node, 2, node),
            ratio);
  }

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++)
    fprintf(file, " %d %d\n", 1 + 2 * edge, 2 + 2 * edge);

  fclose(file);

  return REF_SUCCESS;
}